

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_show_eig(REF_INT n,REF_DBL *a,REF_DBL *values,REF_DBL *vectors)

{
  ulong uVar1;
  ulong uVar2;
  REF_DBL *pRVar3;
  ulong uVar4;
  
  uVar1 = 0;
  if (0 < n) {
    uVar1 = (ulong)(uint)n;
  }
  if (a != (REF_DBL *)0x0) {
    for (uVar2 = 0; uVar4 = (ulong)(uint)n, pRVar3 = a, uVar2 != uVar1; uVar2 = uVar2 + 1) {
      while (uVar4 != 0) {
        putchar(0x20);
        printf("%15.7e",*pRVar3);
        uVar4 = uVar4 - 1;
        pRVar3 = pRVar3 + n;
      }
      putchar(10);
      a = a + 1;
    }
  }
  for (uVar2 = 0; uVar2 != uVar1; uVar2 = uVar2 + 1) {
    printf("%23.15e",values[uVar2]);
    printf(" |");
    pRVar3 = vectors;
    for (uVar4 = 0; (uint)n != uVar4; uVar4 = uVar4 + 1) {
      printf("%15.7e",*pRVar3);
      if ((long)uVar4 < (long)(n + -1)) {
        putchar(0x20);
      }
      pRVar3 = pRVar3 + n;
    }
    putchar(10);
    vectors = vectors + 1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_show_eig(REF_INT n, REF_DBL *a, REF_DBL *values,
                                       REF_DBL *vectors) {
  REF_INT row, col;

  if (NULL != a) {
    for (row = 0; row < n; row++) {
      for (col = 0; col < n; col++) {
        printf(" ");
        printf("%15.7e", a[row + n * col]);
      }
      printf("\n");
    }
  }
  for (row = 0; row < n; row++) {
    printf("%23.15e", values[row]);
    printf(" |");
    for (col = 0; col < n; col++) {
      printf("%15.7e", vectors[row + n * col]);
      if (col < n - 1) printf(" ");
    }
    printf("\n");
  }

  return REF_SUCCESS;
}